

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

hash_t JsUtil::
       BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
       ::GetHashCodeWithKey<Js::JavascriptString*>(JavascriptString **key)

{
  hash_t hVar1;
  JavascriptString **key_local;
  
  hVar1 = Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::GetHashCode(*key);
  return hVar1 << 1 | 1;
}

Assistant:

static hash_t GetHashCodeWithKey(const TLookup& key)
        {
            // set last bit to 1 to avoid false positive to make hash appears to be a valid recycler address.
            // In the same line, 0 should be use to indicate a non-existing entry.
            return TAGHASH(Comparer<TLookup>::GetHashCode(key));
        }